

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gherkin_line.c
# Opt level: O0

wchar_t * find_cell_delimiter(wchar_t *start_pos)

{
  wchar_t *local_20;
  wchar_t *current_pos;
  wchar_t *start_pos_local;
  
  local_20 = start_pos;
  while( true ) {
    if (*local_20 == L'\0') {
      return (wchar_t *)0x0;
    }
    if (*local_20 == L'|') break;
    if (*local_20 == L'\\') {
      local_20 = local_20 + 1;
    }
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

static const wchar_t* find_cell_delimiter(const wchar_t* start_pos) {
    const wchar_t* current_pos = start_pos;
    while (*current_pos != L'\0') {
        if (*current_pos == L'|')
            return current_pos;
        if (*current_pos == L'\\')
            ++current_pos;
        ++current_pos;
    }
    return 0;
}